

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QModelIndex * __thiscall
QTableView::indexAt(QModelIndex *__return_storage_ptr__,QTableView *this,QPoint *pos)

{
  char16_t **this_00;
  QAbstractItemViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  uint y;
  uint x;
  Span *pSVar2;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_01->delayedPendingLayout == true) && (this_01->state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_01);
    (**(code **)(**(long **)&(this_01->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  y = QHeaderView::logicalIndexAt
                (*(QHeaderView **)
                  (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget.field_0x8 + 0x588),(pos->yp).m_i);
  x = QHeaderView::logicalIndexAt
                (*(QHeaderView **)
                  (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget.field_0x8 + 0x580),(pos->xp).m_i);
  if ((int)(x | y) < 0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  else {
    this_00 = &this_01[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
               statusTip.d.ptr;
    if (((char16_t **)
         this_01[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
         statusTip.d.ptr != this_00) &&
       (pSVar2 = QSpanCollection::spanAt((QSpanCollection *)this_00,x,y), pSVar2 != (Span *)0x0)) {
      y = pSVar2->m_top;
      x = pSVar2->m_left;
    }
    pQVar1 = this_01->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&this_01->root);
    (**(code **)(*(long *)pQVar1 + 0x60))(__return_storage_ptr__,pQVar1,y,x,&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableView::indexAt(const QPoint &pos) const
{
    Q_D(const QTableView);
    d->executePostedLayout();
    int r = rowAt(pos.y());
    int c = columnAt(pos.x());
    if (r >= 0 && c >= 0) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            r = span.top();
            c = span.left();
        }
        return d->model->index(r, c, d->root);
    }
    return QModelIndex();
}